

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# address.cpp
# Opt level: O3

string * __thiscall
ot::commissioner::Address::ToString_abi_cxx11_(string *__return_storage_ptr__,Address *this)

{
  pointer __cp;
  char *pcVar1;
  long lVar2;
  char *pcVar3;
  char ipv4 [16];
  char acStack_58 [56];
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  __cp = (this->mBytes).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
         super__Vector_impl_data._M_start;
  lVar2 = (long)(this->mBytes).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                _M_impl.super__Vector_impl_data._M_finish - (long)__cp;
  if (lVar2 == 0x10) {
    pcVar3 = inet_ntop(10,__cp,acStack_58,0x2e);
    pcVar1 = (char *)__return_storage_ptr__->_M_string_length;
    if (pcVar3 == (char *)0x0) {
      pcVar3 = "INVALID_ADDR";
    }
    else {
      strlen(pcVar3);
    }
    std::__cxx11::string::_M_replace((ulong)__return_storage_ptr__,0,pcVar1,(ulong)pcVar3);
  }
  else if (lVar2 == 4) {
    pcVar3 = inet_ntop(2,__cp,acStack_58,0x10);
    pcVar1 = (char *)__return_storage_ptr__->_M_string_length;
    if (pcVar3 == (char *)0x0) {
      pcVar3 = "INVALID_ADDR";
    }
    else {
      strlen(pcVar3);
    }
    std::__cxx11::string::_M_replace((ulong)__return_storage_ptr__,0,pcVar1,(ulong)pcVar3);
  }
  else {
    std::__cxx11::string::_M_replace((ulong)__return_storage_ptr__,0,(char *)0x0,0x2fb91d);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string Address::ToString() const
{
    static const char *kInvalidAddr = "INVALID_ADDR";
    std::string        result;

    if (mBytes.size() == kIpv4Size)
    {
        char ipv4[INET_ADDRSTRLEN];
        auto ret = inet_ntop(AF_INET, mBytes.data(), ipv4, sizeof(ipv4));
        VerifyOrExit(ret != nullptr, result = kInvalidAddr);
        result = ret;
    }
    else if (mBytes.size() == kIpv6Size)
    {
        char ipv6[INET6_ADDRSTRLEN];
        auto ret = inet_ntop(AF_INET6, mBytes.data(), ipv6, sizeof(ipv6));
        VerifyOrExit(ret != nullptr, result = kInvalidAddr);
        result = ret;
    }
    else
    {
        ExitNow(result = kInvalidAddr);
    }

exit:
    return result;
}